

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

size_t __thiscall
std::hash<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::operator()
          (hash<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this,
          Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *x)

{
  uint h3;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_RSI;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> c;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *__end0;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *__begin0;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *__range2;
  uint out;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *self;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar2;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffffa0;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_28;
  uint local_14;
  
  local_14 = Lib::HashUtils::combine(0,0);
  local_28 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::begin
                       (in_RSI);
  pMVar2 = local_28;
  pMVar1 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::end(in_RSI)
  ;
  self = pMVar1;
  for (; local_28 != pMVar1; local_28 = local_28 + 1) {
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
              (in_stack_ffffffffffffffa0,pMVar2);
    h3 = Lib::StlHash::
         hash<Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>>
                   ((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                     *)self);
    Lib::StlHash::hash<Kernel::RationalConstantType>(&self->numeral);
    local_14 = Lib::HashUtils::combine<>((uint)((ulong)self >> 0x20),(uint)self,h3);
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x377a95);
  }
  return (ulong)local_14;
}

Assistant:

size_t operator()(Kernel::Polynom<NumTraits> const& x) const noexcept 
  {
    using namespace Lib;
    using namespace Kernel;

    unsigned out = HashUtils::combine(0,0);
    for (auto c : x._summands) {
      out = HashUtils::combine(
        StlHash::hash(c.factors),
        StlHash::hash(c.numeral),
        out
      );
    }
    return out;
  }